

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2612.c
# Opt level: O0

void YM2612_Reset(ym2612_ *YM2612)

{
  int local_18;
  int local_14;
  int j;
  int i;
  ym2612_ *YM2612_local;
  
  YM2612->LFOcnt = 0;
  YM2612->TimerA = 0;
  YM2612->TimerAL = 0;
  YM2612->TimerAcnt = 0;
  YM2612->TimerB = 0;
  YM2612->TimerBL = 0;
  YM2612->TimerBcnt = 0;
  YM2612->DAC = '\0';
  YM2612->DACdata = 0;
  YM2612->dac_highpass = 0;
  YM2612->Status = 0;
  YM2612->OPNAadr = 0;
  YM2612->OPNBadr = 0;
  YM2612->Inter_Cnt = 0;
  for (local_14 = 0; local_14 < 6; local_14 = local_14 + 1) {
    YM2612->CHANNEL[local_14].Old_OUTd = 0;
    YM2612->CHANNEL[local_14].OUTd = 0;
    YM2612->CHANNEL[local_14].LEFT = -1;
    YM2612->CHANNEL[local_14].RIGHT = -1;
    YM2612->CHANNEL[local_14].ALGO = 0;
    YM2612->CHANNEL[local_14].FB = 0x1f;
    YM2612->CHANNEL[local_14].FMS = 0;
    YM2612->CHANNEL[local_14].AMS = 0;
    for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
      YM2612->CHANNEL[local_14].S0_OUT[local_18] = 0;
      YM2612->CHANNEL[local_14].FNUM[local_18] = 0;
      YM2612->CHANNEL[local_14].FOCT[local_18] = 0;
      YM2612->CHANNEL[local_14].KC[local_18] = 0;
      YM2612->CHANNEL[local_14].SLOT[local_18].DT = YM2612->DT_TAB[0];
      YM2612->CHANNEL[local_14].SLOT[local_18].Fcnt = 0;
      YM2612->CHANNEL[local_14].SLOT[local_18].Finc = 0;
      YM2612->CHANNEL[local_14].SLOT[local_18].Ecnt = 0x20000000;
      YM2612->CHANNEL[local_14].SLOT[local_18].Einc = 0;
      YM2612->CHANNEL[local_14].SLOT[local_18].Ecmp = 0;
      YM2612->CHANNEL[local_14].SLOT[local_18].Ecurp = 3;
      YM2612->CHANNEL[local_14].SLOT[local_18].ChgEnM = 0;
    }
  }
  for (local_14 = 0; local_14 < 0x100; local_14 = local_14 + 1) {
    YM2612->REG[0][local_14] = 0xff;
    YM2612->REG[1][local_14] = 0xff;
  }
  for (local_14 = 0xb6; 0xb3 < local_14; local_14 = local_14 + -1) {
    YM2612_Write(YM2612,'\0',(UINT8)local_14);
    YM2612_Write(YM2612,'\x01',0xc0);
    YM2612_Write(YM2612,'\x02',(UINT8)local_14);
    YM2612_Write(YM2612,'\x03',0xc0);
  }
  for (local_14 = 0xb2; 0x21 < local_14; local_14 = local_14 + -1) {
    YM2612_Write(YM2612,'\0',(UINT8)local_14);
    YM2612_Write(YM2612,'\x01','\0');
    YM2612_Write(YM2612,'\x02',(UINT8)local_14);
    YM2612_Write(YM2612,'\x03','\0');
  }
  YM2612_Write(YM2612,'\0','*');
  YM2612_Write(YM2612,'\x01',0x80);
  return;
}

Assistant:

void YM2612_Reset(ym2612_ *YM2612)
{
  int i, j;

#if YM_DEBUG_LEVEL > 0
  fprintf(debug_file, "\n\nStarting reseting YM2612 ...\n\n");
#endif

  YM2612->LFOcnt = 0;
  YM2612->TimerA = 0;
  YM2612->TimerAL = 0;
  YM2612->TimerAcnt = 0;
  YM2612->TimerB = 0;
  YM2612->TimerBL = 0;
  YM2612->TimerBcnt = 0;
  YM2612->DAC = 0;
  YM2612->DACdata = 0;
  YM2612->dac_highpass = 0;

  YM2612->Status = 0;

  YM2612->OPNAadr = 0;
  YM2612->OPNBadr = 0;
  YM2612->Inter_Cnt = 0;

  for (i = 0; i < 6; i++)
  {
    YM2612->CHANNEL[i].Old_OUTd = 0;
    YM2612->CHANNEL[i].OUTd = 0;
    YM2612->CHANNEL[i].LEFT = 0xFFFFFFFF;
    YM2612->CHANNEL[i].RIGHT = 0xFFFFFFFF;
    YM2612->CHANNEL[i].ALGO = 0;
    YM2612->CHANNEL[i].FB = 31;
    YM2612->CHANNEL[i].FMS = 0;
    YM2612->CHANNEL[i].AMS = 0;

    for (j = 0 ;j < 4 ; j++)
    {
      YM2612->CHANNEL[i].S0_OUT[j] = 0;
      YM2612->CHANNEL[i].FNUM[j] = 0;
      YM2612->CHANNEL[i].FOCT[j] = 0;
      YM2612->CHANNEL[i].KC[j] = 0;

      YM2612->CHANNEL[i].SLOT[j].DT = YM2612->DT_TAB[0];
      YM2612->CHANNEL[i].SLOT[j].Fcnt = 0;
      YM2612->CHANNEL[i].SLOT[j].Finc = 0;
      YM2612->CHANNEL[i].SLOT[j].Ecnt = ENV_END;    // Put it at the end of Decay phase...
      YM2612->CHANNEL[i].SLOT[j].Einc = 0;
      YM2612->CHANNEL[i].SLOT[j].Ecmp = 0;
      YM2612->CHANNEL[i].SLOT[j].Ecurp = RELEASE;

      YM2612->CHANNEL[i].SLOT[j].ChgEnM = 0;
    }
  }

  for (i = 0; i < 0x100; i++)
  {
    YM2612->REG[0][i] = 0xFF;
    YM2612->REG[1][i] = 0xFF;
  }

  for (i = 0xB6; i >= 0xB4; i--)
  {
    YM2612_Write(YM2612, 0, (UINT8) i);
    YM2612_Write(YM2612, 1, 0xC0);
    YM2612_Write(YM2612, 2, (UINT8) i);
    YM2612_Write(YM2612, 3, 0xC0);
  }

  for (i = 0xB2; i >= 0x22; i--)
  {
    YM2612_Write(YM2612, 0, (UINT8) i);
    YM2612_Write(YM2612, 1, 0);
    YM2612_Write(YM2612, 2, (UINT8) i);
    YM2612_Write(YM2612, 3, 0);
  }

  YM2612_Write(YM2612, 0, 0x2A);
  YM2612_Write(YM2612, 1, 0x80);

#if YM_DEBUG_LEVEL > 0
  fprintf(debug_file, "\n\nFinishing reseting YM2612 ...\n\n");
#endif

  return;
}